

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# example_DICEPS.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  bool bVar1;
  time_t tVar2;
  long *plVar3;
  DecPOMDPDiscreteInterface *pDVar4;
  DICEPSPlanner *this;
  ostream *poVar5;
  ulong uVar6;
  long *local_2d8;
  shared_count local_2d0 [8];
  long local_2c8 [2];
  PlanningUnitMADPDiscreteParameters local_2b1;
  undefined4 local_2b0;
  undefined2 local_2ac;
  undefined1 local_2aa;
  double local_2a8;
  Timing Time;
  Arguments args;
  
  ArgumentHandlers::Arguments::Arguments(&args);
  argp_parse(ArgumentHandlers::theArgpStruc,argc,argv,0,0,&args);
  if (-1 < args.verbose) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"DICE: direct CE Policy Search",0x1d);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x30);
    std::ostream::put(-0x30);
    std::ostream::flush();
  }
  tVar2 = time((time_t *)0x0);
  srand((uint)tVar2);
  if (0 < args.verbose) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Horizon = ",10);
    plVar3 = (long *)std::ostream::operator<<((ostream *)&std::cout,args.horizon);
    std::ios::widen((char)*(undefined8 *)(*plVar3 + -0x18) + (char)plVar3);
    std::ostream::put((char)plVar3);
    std::ostream::flush();
  }
  Timing::Timing(&Time);
  local_2d8 = local_2c8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2d8,"Overall","");
  Timing::Start((string *)&Time);
  if (local_2d8 != local_2c8) {
    operator_delete(local_2d8,local_2c8[0] + 1);
  }
  pDVar4 = (DecPOMDPDiscreteInterface *)ArgumentUtils::GetDecPOMDPDiscreteInterfaceFromArgs(&args);
  local_2d8 = local_2c8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2d8,"PlanningUnit","");
  Timing::Start((string *)&Time);
  if (local_2d8 != local_2c8) {
    operator_delete(local_2d8,local_2c8[0] + 1);
  }
  PlanningUnitMADPDiscreteParameters::PlanningUnitMADPDiscreteParameters(&local_2b1);
  PlanningUnitMADPDiscreteParameters::SetComputeAll(SUB81(&local_2b1,0));
  local_2ac = 0;
  local_2b0 = 0x10000;
  local_2aa = args.sparse != 0;
  this = (DICEPSPlanner *)operator_new(0x3b0);
  DICEPSPlanner::DICEPSPlanner
            (this,(long)args.horizon,pDVar4,1,args.nrCEIterations,args.nrCESamples,
             args.nrCESamplesForUpdate,args.CE_use_hard_threshold,args.CE_alpha,
             args.nrCEEvaluationRuns,&local_2b1,false,(ofstream *)0x0,args.verbose);
  local_2d8 = local_2c8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2d8,"PlanningUnit","");
  Timing::Stop((string *)&Time);
  if (local_2d8 != local_2c8) {
    operator_delete(local_2d8,local_2c8[0] + 1);
  }
  if (-1 < args.verbose) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"DICEPSPlanner initialized",0x19);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x30);
    std::ostream::put(-0x30);
    std::ostream::flush();
  }
  if (args.nrCERestarts != 0) {
    uVar6 = 1;
    do {
      local_2d8 = local_2c8;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_2d8,"Plan","");
      Timing::Start((string *)&Time);
      if (local_2d8 != local_2c8) {
        operator_delete(local_2d8,local_2c8[0] + 1);
      }
      (**(code **)(*(long *)this + 0x18))(this);
      local_2d8 = local_2c8;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_2d8,"Plan","");
      Timing::Stop((string *)&Time);
      if (local_2d8 != local_2c8) {
        operator_delete(local_2d8,local_2c8[0] + 1);
      }
      local_2a8 = (double)(**(code **)(*(long *)this + 0x98))(this);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"value=",6);
      poVar5 = std::ostream::_M_insert<double>(local_2a8);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
      std::ostream::put((char)poVar5);
      std::ostream::flush();
      if (0 < args.verbose) {
        (**(code **)(*(long *)this + 0xa0))(&local_2d8,this);
        (**(code **)(*local_2d8 + 0x38))();
        boost::detail::shared_count::~shared_count(local_2d0);
        std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x30);
        std::ostream::put(-0x30);
        std::ostream::flush();
      }
      bVar1 = uVar6 < args.nrCERestarts;
      uVar6 = (ulong)((int)uVar6 + 1);
    } while (bVar1);
  }
  local_2d8 = local_2c8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2d8,"Overall","");
  Timing::Stop((string *)&Time);
  if (local_2d8 != local_2c8) {
    operator_delete(local_2d8,local_2c8[0] + 1);
  }
  if (-1 < args.verbose) {
    Timing::PrintSummary();
    TimedAlgorithm::PrintTimersSummary();
  }
  (**(code **)(*(long *)this + 8))(this);
  PlanningUnitMADPDiscreteParameters::~PlanningUnitMADPDiscreteParameters(&local_2b1);
  Timing::~Timing(&Time);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)args.maxplus_updateT._M_dataplus._M_p != &args.maxplus_updateT.field_2) {
    operator_delete(args.maxplus_updateT._M_dataplus._M_p,
                    args.maxplus_updateT.field_2._M_allocated_capacity + 1);
  }
  return 0;
}

Assistant:

int main(int argc, char **argv)
{
    // parse the command line arguments
    ArgumentHandlers::Arguments args;
    argp_parse (&ArgumentHandlers::theArgpStruc, argc, argv, 0, 0, &args);

    if(args.verbose >= 0)
        cout << "DICE: direct CE Policy Search"<<endl;

    srand(time(0));

    int horizon = args.horizon;
    if(args.verbose >= 1)
        cout << "Horizon = " << horizon << endl;

    try {
    //start timers
    Timing Time;    
    Time.Start("Overall");

    DecPOMDPDiscreteInterface & decpomdp = * GetDecPOMDPDiscreteInterfaceFromArgs(args);
    
    //Initialization of the planner with typical options for JESP:
    Time.Start("PlanningUnit");
    PlanningUnitMADPDiscreteParameters params;
    params.SetComputeAll(true);
    params.SetComputeJointActionObservationHistories(false);
    params.SetComputeJointActionHistories(false);
    params.SetComputeIndividualActionObservationHistories(false);
    params.SetComputeIndividualActionHistories(false);
    //params.SetComputeIndividualObservationHistories(false);
    // joint observations histories are needed for
    // efficient computation of joint actions
    params.SetComputeJointObservationHistories(true);
    params.SetComputeJointBeliefs(false);
    if(args.sparse)
        params.SetUseSparseJointBeliefs(true);
    else
        params.SetUseSparseJointBeliefs(false);
    DICEPSPlanner* planner;
    planner = new DICEPSPlanner (
        horizon,
        &decpomdp,
        //CE params
        1, // the restarts loop is executed here, not in DICEPSPlanner
        args.nrCEIterations,
        args.nrCESamples,
        args.nrCESamplesForUpdate, 
        args.CE_use_hard_threshold, //(gamma in CE papers)
        args.CE_alpha, //the learning rate
        args.nrCEEvaluationRuns, //the number of evaluation runs
        &params, false, 0, args.verbose
    );
    Time.Stop("PlanningUnit");
    if(args.verbose >= 0)
        cout << "DICEPSPlanner initialized" << endl;

    for(Index restartI = 0; restartI < args.nrCERestarts; restartI++)
    {
        Time.Start("Plan");
        planner->Plan();
        Time.Stop("Plan");

        double V = planner->GetExpectedReward();
        cout << "value="<< V << endl;
        if(args.verbose >= 1)
        {
            planner->GetJointPolicyPureVector()->Print();
            cout <<  endl;
        }
    }
    /* clean up */

    Time.Stop("Overall");

    if(args.verbose >= 0)
    {
        Time.PrintSummary();
        planner->PrintTimersSummary();
    }

    delete planner;
    }
    catch(E& e){ e.Print(); }
}